

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O2

void __thiscall Kvm::displayValue(Kvm *this,Value *v,ostream *out)

{
  char cVar1;
  char *pcVar2;
  
  if (((ulong)v & 1) != 0) {
    std::ostream::_M_insert<long>((long)out);
    return;
  }
  if (((ulong)v & 2) == 0) {
    switch(v->type_) {
    case BOOLEAN:
      pcVar2 = "#f";
      if (*(char *)&v[1]._vptr_Value != '\0') {
        pcVar2 = "#t";
      }
      break;
    case STRING:
    case SYMBOL:
      pcVar2 = (char *)v[1]._vptr_Value;
      break;
    default:
      pcVar2 = "`display` primitive is not implemented for this object";
      break;
    case CELL:
      std::operator<<(out,'(');
      displayCell(this,v,out);
      cVar1 = ')';
      goto LAB_0010adf0;
    }
    std::operator<<(out,pcVar2);
    return;
  }
  cVar1 = (char)((ulong)v >> 2);
LAB_0010adf0:
  std::operator<<(out,cVar1);
  return;
}

Assistant:

void Kvm::displayValue(const Value *v, std::ostream &out)
{
    if (IS_INT(v))
    {
        out << TK_INT(v);
    } else if (IS_CHR(v))
    {
        out << TK_CHR(v);
    } else 
    {
        switch (v->type())
        {
            case ValueType::BOOLEAN:
                out << (static_cast<const Boolean *>(v)->value_ ? "#t" : "#f");
                break;
            case ValueType::STRING:
                out << (static_cast<const String *>(v)->value_);
                break;
            case ValueType::SYMBOL:
                out << (static_cast<const String *>(v)->value_);
                break;
            case ValueType::CELL:
                out << '(';
                displayCell(v, out);
                out << ')';
                break;
            default:
                out << "`display` primitive is not implemented for this object";
                break;
        }
    }
}